

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_byte_array_stop_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  size_t __n;
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uchar uVar11;
  long lVar12;
  size_t sVar13;
  cram_block *pcVar14;
  int iVar15;
  uchar *__src;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    iVar15 = slice->hdr->num_blocks;
    iVar4 = -1;
    if (0 < (long)iVar15) {
      lVar9 = 0;
      do {
        pcVar14 = slice->block[lVar9];
        if (((pcVar14 != (cram_block *)0x0) && (pcVar14->content_type == EXTERNAL)) &&
           (pcVar14->content_id == (c->field_6).external.type)) {
          if (iVar15 == (int)lVar9) {
            return -1;
          }
          goto LAB_0015822f;
        }
        lVar9 = lVar9 + 1;
      } while (iVar15 != lVar9);
    }
  }
  else {
    pcVar14 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar14 == (cram_block *)0x0) {
      iVar4 = -(uint)(*out_size != 0);
    }
    else {
LAB_0015822f:
      iVar15 = pcVar14->idx;
      uVar7 = (ulong)iVar15;
      iVar2 = pcVar14->uncomp_size;
      lVar9 = (long)iVar2;
      iVar4 = -1;
      if (iVar15 < iVar2) {
        puVar3 = pcVar14->data;
        __src = puVar3 + uVar7;
        uVar8 = *(ulong *)(out_ + 0x28);
        lVar6 = *(long *)(out_ + 0x30);
        uVar1 = (c->field_6).byte_array_stop.stop;
        if (lVar9 - uVar7 < uVar8 - lVar6) {
          lVar10 = *(long *)(out_ + 0x20);
          lVar6 = lVar6 + lVar10;
          uVar11 = *__src;
          if (iVar15 != iVar2 && uVar11 != uVar1) {
            lVar10 = 0;
            do {
              *(uchar *)(lVar6 + lVar10) = uVar11;
              uVar11 = puVar3[lVar10 + uVar7 + 1];
              lVar12 = lVar10 + 1;
              if (uVar11 == uVar1) break;
              bVar16 = ~uVar7 + lVar9 != lVar10;
              lVar10 = lVar12;
            } while (bVar16);
            lVar10 = *(long *)(out_ + 0x20);
            __src = __src + lVar12;
            lVar6 = lVar6 + lVar12;
          }
          iVar15 = (int)__src;
          *(long *)(out_ + 0x30) = lVar6 - lVar10;
        }
        else {
          lVar10 = 2;
          sVar13 = 0xffffffffffffffff;
          do {
            __n = sVar13 + 1;
            lVar10 = lVar10 + -2;
            if (__src[sVar13 + 1] == uVar1) break;
            lVar12 = sVar13 + (uVar7 - lVar9);
            sVar13 = __n;
          } while (lVar12 != -1);
          pvVar5 = *(void **)(out_ + 0x20);
          if (uVar8 <= lVar6 + __n) {
            do {
              auVar17._8_4_ = (int)(uVar8 >> 0x20);
              auVar17._0_8_ = uVar8;
              auVar17._12_4_ = 0x45300000;
              dVar19 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
              uVar7 = (ulong)dVar19;
              sVar13 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
              if (uVar8 == 0) {
                sVar13 = 0x400;
              }
              *(size_t *)(out_ + 0x28) = sVar13;
              pvVar5 = realloc(pvVar5,sVar13);
              *(void **)(out_ + 0x20) = pvVar5;
              uVar8 = *(ulong *)(out_ + 0x28);
              lVar6 = *(long *)(out_ + 0x30);
            } while (uVar8 <= __n + lVar6);
          }
          iVar15 = (int)__src + (int)__n;
          memcpy((void *)((long)pvVar5 + lVar6),__src,__n);
          uVar7 = *(ulong *)(out_ + 0x28);
          lVar9 = *(long *)(out_ + 0x30);
          *(size_t *)(out_ + 0x30) = lVar9 + __n;
          if (uVar7 <= (ulong)(lVar9 - lVar10)) {
            pvVar5 = *(void **)(out_ + 0x20);
            do {
              auVar18._8_4_ = (int)(uVar7 >> 0x20);
              auVar18._0_8_ = uVar7;
              auVar18._12_4_ = 0x45300000;
              dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
              uVar8 = (ulong)dVar19;
              sVar13 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
              if (uVar7 == 0) {
                sVar13 = 0x400;
              }
              *(size_t *)(out_ + 0x28) = sVar13;
              pvVar5 = realloc(pvVar5,sVar13);
              *(void **)(out_ + 0x20) = pvVar5;
              uVar7 = *(ulong *)(out_ + 0x28);
            } while (uVar7 <= *(long *)(out_ + 0x30) + __n);
          }
        }
        iVar4 = *(int *)&pcVar14->data;
        *out_size = iVar15 - (pcVar14->idx + iVar4);
        pcVar14->idx = (iVar15 - iVar4) + 1;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int cram_byte_array_stop_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;
    char *cp, *out_cp, *cp_end;
    char stop;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	int i;
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;
    cp = (char *)b->data + b->idx;
    cp_end = (char *)b->data + b->uncomp_size;
    out_cp = (char *)BLOCK_END(out);

    stop = c->byte_array_stop.stop;
    if (cp_end - cp < out->alloc - out->byte) {
	while (*cp != stop && cp != cp_end)
	    *out_cp++ = *cp++;
	BLOCK_SIZE(out) = out_cp - (char *)BLOCK_DATA(out);
    } else {
	char *cp_start;
	for (cp_start = cp; *cp != stop && cp != cp_end; cp++)
	    ;
	BLOCK_APPEND(out, cp_start, cp - cp_start);
	BLOCK_GROW(out, cp - cp_start);
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}